

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitMemoryGrow(FunctionValidator *this,MemoryGrow *curr)

{
  Module *this_00;
  Memory *pMVar1;
  Memory *memory;
  MemoryGrow *curr_local;
  FunctionValidator *this_local;
  
  this_00 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
            getModule(&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  pMVar1 = Module::getMemoryOrNull(this_00,(Name)(curr->memory).super_IString.str);
  shouldBeTrue<wasm::MemoryGrow*>(this,pMVar1 != (Memory *)0x0,curr,"memory.grow memory must exist")
  ;
  shouldBeEqualOrFirstIsUnreachable<wasm::MemoryGrow*,wasm::Type>
            (this,(Type)(curr->delta->type).id,(Type)(pMVar1->addressType).id,curr,
             "memory.grow must match memory index type");
  return;
}

Assistant:

void FunctionValidator::visitMemoryGrow(MemoryGrow* curr) {
  auto* memory = getModule()->getMemoryOrNull(curr->memory);
  shouldBeTrue(!!memory, curr, "memory.grow memory must exist");
  shouldBeEqualOrFirstIsUnreachable(curr->delta->type,
                                    memory->addressType,
                                    curr,
                                    "memory.grow must match memory index type");
}